

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGhsMultiGenerator::ComputeObjectFilenames
          (cmLocalGhsMultiGenerator *this,
          map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *mapping,cmGeneratorTarget *gt)

{
  int iVar1;
  bool bVar2;
  string *psVar3;
  reference ppVar4;
  mapped_type_conflict *pmVar5;
  string local_340;
  bool local_319;
  undefined1 local_318 [7];
  bool keptSourceExtension;
  string local_2f8;
  cmAlphaNum local_2d8;
  string local_2a8;
  cmAlphaNum local_288;
  undefined1 local_258 [8];
  string objectName;
  cmSourceFile *sf_1;
  pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *si_1;
  iterator __end1_1;
  iterator __begin1_1;
  map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1_1;
  cmAlphaNum local_1f0;
  string local_1c0;
  string local_1a0;
  cmAlphaNum local_180;
  undefined1 local_150 [8];
  string objectNameLower;
  cmSourceFile *sf;
  pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *si;
  iterator __end1;
  iterator __begin1;
  map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  counts;
  char local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  cmAlphaNum local_a0;
  cmAlphaNum local_70;
  undefined1 local_40 [8];
  string dir_max;
  cmGeneratorTarget *gt_local;
  map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *mapping_local;
  cmLocalGhsMultiGenerator *this_local;
  
  dir_max.field_2._8_8_ = gt;
  psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(&this->super_cmLocalGenerator);
  cmAlphaNum::cmAlphaNum(&local_70,psVar3);
  cmAlphaNum::cmAlphaNum(&local_a0,'/');
  (*(this->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xe])
            (&local_c0,this,dir_max.field_2._8_8_);
  local_c1 = '/';
  cmStrCat<std::__cxx11::string,char>((string *)local_40,&local_70,&local_a0,&local_c0,&local_c1);
  std::__cxx11::string::~string((string *)&local_c0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)&__range1);
  __end1 = std::
           map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(mapping);
  si = (pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)std::
          map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::end(mapping);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&si);
    if (!bVar2) break;
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&__end1);
    objectNameLower.field_2._8_8_ = ppVar4->first;
    psVar3 = cmSourceFile::GetFullPath_abi_cxx11_((cmSourceFile *)objectNameLower.field_2._8_8_);
    cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_1c0,psVar3);
    cmsys::SystemTools::LowerCase(&local_1a0,&local_1c0);
    cmAlphaNum::cmAlphaNum(&local_180,&local_1a0);
    cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
              ((string *)&__range1_1,(this->super_cmLocalGenerator).GlobalGenerator,
               (cmSourceFile *)objectNameLower.field_2._8_8_);
    cmAlphaNum::cmAlphaNum(&local_1f0,(string *)&__range1_1);
    cmStrCat<>((string *)local_150,&local_180,&local_1f0);
    std::__cxx11::string::~string((string *)&__range1_1);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)&__range1,(key_type *)local_150);
    *pmVar5 = *pmVar5 + 1;
    std::__cxx11::string::~string((string *)local_150);
    std::
    _Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(mapping);
  si_1 = (pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)std::
            map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::end(mapping);
  while( true ) {
    bVar2 = std::operator!=(&__end1_1,(_Self *)&si_1);
    if (!bVar2) break;
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&__end1_1);
    objectName.field_2._8_8_ = ppVar4->first;
    psVar3 = cmSourceFile::GetFullPath_abi_cxx11_((cmSourceFile *)objectName.field_2._8_8_);
    cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_2a8,psVar3);
    cmAlphaNum::cmAlphaNum(&local_288,&local_2a8);
    cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
              (&local_2f8,(this->super_cmLocalGenerator).GlobalGenerator,
               (cmSourceFile *)objectName.field_2._8_8_);
    cmAlphaNum::cmAlphaNum(&local_2d8,&local_2f8);
    cmStrCat<>((string *)local_258,&local_288,&local_2d8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2a8);
    cmsys::SystemTools::LowerCase((string *)local_318,(string *)local_258);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)&__range1,(key_type *)local_318);
    iVar1 = *pmVar5;
    std::__cxx11::string::~string((string *)local_318);
    if (1 < iVar1) {
      cmGeneratorTarget::AddExplicitObjectName
                ((cmGeneratorTarget *)dir_max.field_2._8_8_,(cmSourceFile *)objectName.field_2._8_8_
                );
      cmLocalGenerator::GetObjectFileNameWithoutTarget
                (&local_340,&this->super_cmLocalGenerator,(cmSourceFile *)objectName.field_2._8_8_,
                 (string *)local_40,&local_319,(char *)0x0);
      std::__cxx11::string::operator=((string *)local_258,(string *)&local_340);
      std::__cxx11::string::~string((string *)&local_340);
      cmsys::SystemTools::ReplaceString((string *)local_258,"/","_");
    }
    std::__cxx11::string::operator=((string *)&ppVar4->second,(string *)local_258);
    std::__cxx11::string::~string((string *)local_258);
    std::
    _Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1_1);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)&__range1);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmLocalGhsMultiGenerator::ComputeObjectFilenames(
  std::map<cmSourceFile const*, std::string>& mapping,
  cmGeneratorTarget const* gt)
{
  std::string dir_max = cmStrCat(this->GetCurrentBinaryDirectory(), '/',
                                 this->GetTargetDirectory(gt), '/');

  // Count the number of object files with each name.  Note that
  // filesystem may not be case sensitive.
  std::map<std::string, int> counts;

  for (auto const& si : mapping) {
    cmSourceFile const* sf = si.first;
    std::string objectNameLower = cmStrCat(
      cmSystemTools::LowerCase(
        cmSystemTools::GetFilenameWithoutLastExtension(sf->GetFullPath())),
      this->GlobalGenerator->GetLanguageOutputExtension(*sf));
    counts[objectNameLower] += 1;
  }

  // For all source files producing duplicate names we need unique
  // object name computation.
  for (auto& si : mapping) {
    cmSourceFile const* sf = si.first;
    std::string objectName = cmStrCat(
      cmSystemTools::GetFilenameWithoutLastExtension(sf->GetFullPath()),
      this->GlobalGenerator->GetLanguageOutputExtension(*sf));

    if (counts[cmSystemTools::LowerCase(objectName)] > 1) {
      const_cast<cmGeneratorTarget*>(gt)->AddExplicitObjectName(sf);
      bool keptSourceExtension;
      objectName = this->GetObjectFileNameWithoutTarget(*sf, dir_max,
                                                        &keptSourceExtension);
      cmsys::SystemTools::ReplaceString(objectName, "/", "_");
    }
    si.second = objectName;
  }
}